

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O0

Matcher<int> * __thiscall
testing::internal::ComparisonBase::operator_cast_to_Matcher
          (Matcher<int> *__return_storage_ptr__,ComparisonBase *this)

{
  Impl<int> *this_00;
  ComparisonBase<testing::internal::EqMatcher<int>,_int,_testing::internal::AnyEq> *this_local;
  
  this_00 = (Impl<int> *)operator_new(0x10);
  ComparisonBase<testing::internal::EqMatcher<int>,_int,_testing::internal::AnyEq>::Impl<int>::Impl
            (this_00,(int *)this);
  MakeMatcher<int>(__return_storage_ptr__,(MatcherInterface<int> *)this_00);
  return __return_storage_ptr__;
}

Assistant:

operator Matcher<Lhs>() const {
    return MakeMatcher(new Impl<Lhs>(rhs_));
  }